

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::Alice(Alice *this)

{
  Server *this_00;
  string local_48;
  
  (this->super_Party).pc = 0;
  (this->super_Party).output = 0;
  (this->super_Party).n_p = 0;
  (this->super_Party).n_d = 0;
  (this->super_Party).rc = 0;
  (this->super_Party).alpha_rc = 0;
  (this->super_Party).termination_condition = false;
  (this->super_Party).trace = false;
  memset(&(this->super_Party).P,0,0xf0);
  (this->Pi_P_diff_R_PB_R_PA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Pi_P_diff_R_PB_R_PA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Pi_P_diff_R_PB_R_PA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Pi_D_diff_R_DB_R_DA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Pi_D_diff_R_DB_R_DA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Pi_D_diff_R_DB_R_DA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoadProgramShare(this);
  LoadDataShare(this);
  LoadCorrelatedRandoms(this);
  LoadAlphaRandoms(this);
  LoadNextRandomPermutation(this);
  LoadNextShuffleVectors(this);
  this_00 = (Server *)operator_new(0x180);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Alice","");
  Server::Server(this_00,&local_48);
  this->srv = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Alice::Alice()
{
    LoadProgramShare();
    LoadDataShare();
    LoadCorrelatedRandoms();
    LoadAlphaRandoms();
    LoadNextRandomPermutation();
    LoadNextShuffleVectors();  
    srv = new Server("Alice");    
}